

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PorterStep3(char *aBuf,int *pnBuf)

{
  int iVar1;
  int iVar2;
  int nBuf;
  int ret;
  int *pnBuf_local;
  char *aBuf_local;
  
  iVar1 = *pnBuf;
  switch(aBuf[iVar1 + -2]) {
  case 'a':
    if (((4 < iVar1) && (iVar2 = memcmp("ical",aBuf + (iVar1 + -4),4), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -4), iVar2 != 0)) {
      (aBuf + (iVar1 + -4))[0] = 'i';
      (aBuf + (iVar1 + -4))[1] = 'c';
      *pnBuf = iVar1 + -2;
    }
    break;
  case 's':
    if (((4 < iVar1) && (iVar2 = memcmp("ness",aBuf + (iVar1 + -4),4), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -4), iVar2 != 0)) {
      *pnBuf = iVar1 + -4;
    }
    break;
  case 't':
    if ((iVar1 < 6) || (iVar2 = memcmp("icate",aBuf + (iVar1 + -5),5), iVar2 != 0)) {
      if ((5 < iVar1) &&
         ((iVar2 = memcmp("iciti",aBuf + (iVar1 + -5),5), iVar2 == 0 &&
          (iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -5), iVar2 != 0)))) {
        (aBuf + (iVar1 + -5))[0] = 'i';
        (aBuf + (iVar1 + -5))[1] = 'c';
        *pnBuf = iVar1 + -3;
      }
    }
    else {
      iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -5);
      if (iVar2 != 0) {
        (aBuf + (iVar1 + -5))[0] = 'i';
        (aBuf + (iVar1 + -5))[1] = 'c';
        *pnBuf = iVar1 + -3;
      }
    }
    break;
  case 'u':
    if (((3 < iVar1) && (iVar2 = memcmp("ful",aBuf + (iVar1 + -3),3), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -3), iVar2 != 0)) {
      *pnBuf = iVar1 + -3;
    }
    break;
  case 'v':
    if (((5 < iVar1) && (iVar2 = memcmp("ative",aBuf + (iVar1 + -5),5), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -5), iVar2 != 0)) {
      *pnBuf = iVar1 + -5;
    }
    break;
  case 'z':
    if (((5 < iVar1) && (iVar2 = memcmp("alize",aBuf + (iVar1 + -5),5), iVar2 == 0)) &&
       (iVar2 = fts5Porter_MGt0(aBuf,iVar1 + -5), iVar2 != 0)) {
      (aBuf + (iVar1 + -5))[0] = 'a';
      (aBuf + (iVar1 + -5))[1] = 'l';
      *pnBuf = iVar1 + -3;
    }
  }
  return 0;
}

Assistant:

static int fts5PorterStep3(char *aBuf, int *pnBuf){
  int ret = 0;
  int nBuf = *pnBuf;
  switch( aBuf[nBuf-2] ){
    
    case 'a': 
      if( nBuf>4 && 0==memcmp("ical", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt0(aBuf, nBuf-4) ){
          memcpy(&aBuf[nBuf-4], "ic", 2);
          *pnBuf = nBuf - 4 + 2;
        }
      }
      break;
  
    case 's': 
      if( nBuf>4 && 0==memcmp("ness", &aBuf[nBuf-4], 4) ){
        if( fts5Porter_MGt0(aBuf, nBuf-4) ){
          *pnBuf = nBuf - 4;
        }
      }
      break;
  
    case 't': 
      if( nBuf>5 && 0==memcmp("icate", &aBuf[nBuf-5], 5) ){
        if( fts5Porter_MGt0(aBuf, nBuf-5) ){
          memcpy(&aBuf[nBuf-5], "ic", 2);
          *pnBuf = nBuf - 5 + 2;
        }
      }else if( nBuf>5 && 0==memcmp("iciti", &aBuf[nBuf-5], 5) ){
        if( fts5Porter_MGt0(aBuf, nBuf-5) ){
          memcpy(&aBuf[nBuf-5], "ic", 2);
          *pnBuf = nBuf - 5 + 2;
        }
      }
      break;
  
    case 'u': 
      if( nBuf>3 && 0==memcmp("ful", &aBuf[nBuf-3], 3) ){
        if( fts5Porter_MGt0(aBuf, nBuf-3) ){
          *pnBuf = nBuf - 3;
        }
      }
      break;
  
    case 'v': 
      if( nBuf>5 && 0==memcmp("ative", &aBuf[nBuf-5], 5) ){
        if( fts5Porter_MGt0(aBuf, nBuf-5) ){
          *pnBuf = nBuf - 5;
        }
      }
      break;
  
    case 'z': 
      if( nBuf>5 && 0==memcmp("alize", &aBuf[nBuf-5], 5) ){
        if( fts5Porter_MGt0(aBuf, nBuf-5) ){
          memcpy(&aBuf[nBuf-5], "al", 2);
          *pnBuf = nBuf - 5 + 2;
        }
      }
      break;
  
  }
  return ret;
}